

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback_queue.cpp
# Opt level: O0

bool __thiscall miniros::CallbackQueue::isEnabled(CallbackQueue *this)

{
  byte bVar1;
  scoped_lock<std::mutex> *in_RDI;
  scoped_lock<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffd8;
  
  std::scoped_lock<std::mutex>::scoped_lock(in_RDI,in_stack_ffffffffffffffd8);
  bVar1 = *(byte *)&in_RDI[0x2d]._M_device;
  std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x41fa6a);
  return (bool)(bVar1 & 1);
}

Assistant:

bool CallbackQueue::isEnabled()
{
  std::scoped_lock<std::mutex> lock(mutex_);

  return enabled_;
}